

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

void __thiscall si9ma::SinglyLinkedList::print_list(SinglyLinkedList *this,string *separator)

{
  ostream *poVar1;
  
  while (this = (SinglyLinkedList *)this->head, this != (SinglyLinkedList *)0x0) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->size);
    std::operator<<(poVar1,(string *)separator);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void SinglyLinkedList::print_list(string separator) {
        SinglyNodeWithRand *ptr = head;
        while (ptr != nullptr){
            std::cout << ptr->value << separator;
            ptr = ptr->next;
        }

        std::cout << std::endl;
    }